

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_generic_fwrite(mcpl_generic_wfilehandle_t *fh,char *src,uint64_t nbytes)

{
  size_t sVar1;
  
  if (nbytes < 0x20000000) {
    if (nbytes == 0) {
      return;
    }
  }
  else {
    do {
      mcpl_generic_fwrite(fh,src,0x1fffffff);
      nbytes = nbytes - 0x1fffffff;
      src = src + 0x1fffffff;
    } while (0x1fffffff < nbytes);
  }
  sVar1 = fwrite(src,1,nbytes,(FILE *)fh->internal);
  fh->current_pos = fh->current_pos + sVar1;
  if (sVar1 == nbytes) {
    return;
  }
  (*mcpl_error_handler)("Error while writing to file");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_generic_fwrite( mcpl_generic_wfilehandle_t* fh,
                          const char * src, uint64_t nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(int) >= sizeof(int32_t) );

  //Write nbytes. For safety, we do this in chunks well inside 32bit limit.
  const uint64_t chunk_max = INT32_MAX / 4;
  while ( nbytes > chunk_max ) {
    mcpl_generic_fwrite( fh, src, chunk_max );
    nbytes -= chunk_max;
    src += chunk_max;
  }

  if ( !nbytes )
    return;

  size_t to_write = (size_t)nbytes;
  size_t written = fwrite( src, 1, to_write, (FILE*)(fh->internal) );
  fh->current_pos += written;
  if ( written != to_write )
    mcpl_error("Error while writing to file");
}